

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  ImVec2 pos_00;
  ImVec2 IVar4;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar5;
  char *text;
  bool bVar6;
  bool bVar7;
  ImGuiID IVar8;
  ImU32 IVar9;
  ImU32 IVar10;
  ImGuiWindow *pIVar11;
  ImGuiContext *g;
  ImDrawCornerFlags rounding_corners;
  uint uVar12;
  float fVar13;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  bool hovered;
  bool held;
  ImRect frame_bb;
  char name [16];
  ImVec2 size_expected;
  ImRect r_outer;
  ImVec2 pos;
  ImRect total_bb;
  bool local_101;
  float local_100;
  bool local_f9;
  ImRect local_f8;
  ImGuiID local_dc;
  ImVec2 local_d8 [2];
  undefined1 local_c8 [16];
  uint local_b4;
  ImVec2 local_b0;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  char *local_70;
  char *local_68;
  ImVec2 local_60;
  ImRect local_58;
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar5 = GImGui;
  uVar12 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar12 & 0xffffffef;
  pIVar11 = pIVar5->CurrentWindow;
  pIVar11->WriteAccessed = true;
  if (pIVar11->SkipItems != false) {
    return false;
  }
  local_68 = preview_value;
  if ((~flags & 0x60U) == 0) {
    __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                  ,0x592,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  IVar8 = ImGuiWindow::GetID(pIVar11,label,(char *)0x0);
  local_100 = 0.0;
  if ((flags & 0x20U) == 0) {
    local_100 = GetFrameHeight();
  }
  IVar4 = CalcTextSize(label,(char *)0x0,true,-1.0);
  local_88._8_4_ = extraout_XMM0_Dc;
  local_88._0_4_ = IVar4.x;
  local_88._4_4_ = IVar4.y;
  local_88._12_4_ = extraout_XMM0_Dd;
  fVar13 = CalcItemWidth();
  uStack_a4 = 0;
  uStack_a0 = 0;
  uStack_9c = 0;
  local_a8 = local_100;
  if ((flags & 0x40U) == 0) {
    local_a8 = fVar13;
    uStack_a4 = extraout_XMM0_Db;
    uStack_a0 = extraout_XMM0_Dc_00;
    uStack_9c = extraout_XMM0_Dd_00;
  }
  fVar13 = (pIVar5->Style).FramePadding.y;
  local_f8.Min.x = (pIVar11->DC).CursorPos.x;
  local_f8.Min.y = (pIVar11->DC).CursorPos.y;
  local_f8.Max.x = local_a8 + local_f8.Min.x;
  local_f8.Max.y = fVar13 + fVar13 + (float)local_88._4_4_ + local_f8.Min.y;
  local_40.Max.x = 0.0;
  if (0.0 < (float)local_88._0_4_) {
    local_40.Max.x = (pIVar5->Style).ItemInnerSpacing.x + (float)local_88._0_4_;
  }
  local_40.Max.x = local_40.Max.x + local_f8.Max.x;
  local_40.Max.y = local_f8.Max.y + 0.0;
  local_dc = IVar8;
  local_40.Min.x = local_f8.Min.x;
  local_40.Min.y = local_f8.Min.y;
  ItemSize(&local_40,fVar13);
  IVar8 = local_dc;
  bVar6 = ItemAdd(&local_40,local_dc,&local_f8);
  if (!bVar6) {
    return false;
  }
  local_b4 = uVar12;
  local_70 = label;
  bVar6 = ButtonBehavior(&local_f8,IVar8,&local_101,&local_f9,0);
  bVar7 = IsPopupOpen(IVar8);
  IVar9 = GetColorU32(local_101 + 7,1.0);
  local_c8 = ZEXT416((uint)local_f8.Min.x);
  local_98 = ZEXT416((uint)local_f8.Max.x);
  RenderNavHighlight(&local_f8,IVar8,1);
  uVar12 = -(uint)((float)local_98._0_4_ - local_100 <= (float)local_c8._0_4_);
  local_c8._0_4_ = uVar12 & local_c8._0_4_ | ~uVar12 & (uint)((float)local_98._0_4_ - local_100);
  local_c8._4_4_ = local_98._4_4_ & local_c8._4_4_;
  local_c8._8_4_ = local_98._8_4_ & local_c8._8_4_;
  local_c8._12_4_ = local_98._12_4_ & local_c8._12_4_;
  if ((flags & 0x40U) == 0) {
    local_d8[0].y = local_f8.Max.y;
    local_d8[0].x = (float)local_c8._0_4_;
    rounding_corners = 0xf;
    if ((flags & 0x20U) == 0) {
      rounding_corners = 5;
    }
    ImDrawList::AddRectFilled
              (pIVar11->DrawList,&local_f8.Min,local_d8,IVar9,(pIVar5->Style).FrameRounding,
               rounding_corners);
  }
  text = local_70;
  if ((flags & 0x20U) == 0) {
    IVar9 = GetColorU32(((byte)(local_101 | bVar7) & 1) + 0x15,1.0);
    IVar10 = GetColorU32(0,1.0);
    local_98._0_4_ = IVar10;
    local_d8[0].y = local_f8.Min.y;
    local_d8[0].x = (float)local_c8._0_4_;
    ImDrawList::AddRectFilled
              (pIVar11->DrawList,local_d8,&local_f8.Max,IVar9,(pIVar5->Style).FrameRounding,
               (uint)(local_a8 <= local_100) * 5 + 10);
    if (((float)local_c8._0_4_ + local_100) - (pIVar5->Style).FramePadding.x <= local_f8.Max.x) {
      fVar13 = (pIVar5->Style).FramePadding.y;
      IVar4.y = fVar13 + local_f8.Min.y;
      IVar4.x = fVar13 + (float)local_c8._0_4_;
      RenderArrow(pIVar11->DrawList,IVar4,local_98._0_4_,3,1.0);
    }
  }
  p_min.y = local_f8.Min.y;
  p_min.x = local_f8.Min.x;
  p_max.y = local_f8.Max.y;
  p_max.x = local_f8.Max.x;
  RenderFrameBorder(p_min,p_max,(pIVar5->Style).FrameRounding);
  if (local_68 != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
    IVar4 = (pIVar5->Style).FramePadding;
    local_d8[0].x = IVar4.x + local_f8.Min.x;
    local_d8[0].y = IVar4.y + local_f8.Min.y;
    local_58.Min.y = local_f8.Max.y;
    local_58.Min.x = (float)local_c8._0_4_;
    local_b0.x = 0.0;
    local_b0.y = 0.0;
    RenderTextClipped(local_d8,&local_58.Min,local_68,(char *)0x0,(ImVec2 *)0x0,&local_b0,
                      (ImRect *)0x0);
  }
  IVar8 = local_dc;
  if (0.0 < (float)local_88._0_4_) {
    pos_00.y = (pIVar5->Style).FramePadding.y + local_f8.Min.y;
    pos_00.x = (pIVar5->Style).ItemInnerSpacing.x + local_f8.Max.x;
    RenderText(pos_00,text,(char *)0x0,true);
  }
  if (bVar6) {
    if (!bVar7) goto LAB_001ff6b4;
  }
  else if (pIVar5->NavActivateId == IVar8 && !bVar7) {
LAB_001ff6b4:
    if ((pIVar11->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
      pIVar11->NavLastIds[0] = IVar8;
    }
    OpenPopupEx(IVar8);
  }
  else if (!bVar7) {
    return false;
  }
  if ((local_b4 & 0x10) != 0) {
    *(byte *)&(pIVar5->NextWindowData).Flags = (byte)(pIVar5->NextWindowData).Flags | 0x10;
    fVar13 = (pIVar5->NextWindowData).SizeConstraintRect.Min.x;
    uVar12 = -(uint)(local_a8 <= fVar13);
    (pIVar5->NextWindowData).SizeConstraintRect.Min.x =
         (float)(~uVar12 & (uint)local_a8 | (uint)fVar13 & uVar12);
    goto LAB_001ff7cf;
  }
  uVar12 = flags | 4;
  if ((flags & 0x1eU) != 0) {
    uVar12 = flags;
  }
  uVar1 = (uVar12 & 0x1e) - 1;
  if ((uVar12 & 0x1e ^ uVar1) <= uVar1) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                  ,0x5cc,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  if ((uVar12 & 4) == 0) {
    if ((uVar12 & 2) != 0) {
      fVar13 = 4.0;
      goto LAB_001ff770;
    }
    if ((uVar12 & 8) != 0) {
      fVar13 = 20.0;
      goto LAB_001ff770;
    }
    fVar13 = 3.4028235e+38;
  }
  else {
    fVar13 = 8.0;
LAB_001ff770:
    fVar2 = (GImGui->Style).WindowPadding.y;
    fVar3 = (GImGui->Style).ItemSpacing.y;
    fVar13 = fVar2 + fVar2 + ((GImGui->FontSize + fVar3) * fVar13 - fVar3);
  }
  local_d8[0].y = 0.0;
  local_d8[0].x = local_a8;
  local_58.Min.y = fVar13;
  local_58.Min.x = 3.4028235e+38;
  SetNextWindowSizeConstraints(local_d8,&local_58.Min,(ImGuiSizeCallback)0x0,(void *)0x0);
  flags = uVar12;
LAB_001ff7cf:
  ImFormatString((char *)local_d8,0x10,"##Combo_%02d",(ulong)(uint)(pIVar5->BeginPopupStack).Size);
  pIVar11 = FindWindowByName((char *)local_d8);
  if ((pIVar11 != (ImGuiWindow *)0x0) && (pIVar11->WasActive == true)) {
    local_b0 = CalcWindowExpectedSize(pIVar11);
    if ((flags & 1U) != 0) {
      pIVar11->AutoPosLastDirection = 0;
    }
    local_58 = GetWindowAllowedExtentRect(pIVar11);
    local_60.y = local_f8.Max.y;
    local_60.x = local_f8.Min.x;
    local_48 = FindBestWindowPosForPopupEx
                         (&local_60,&local_b0,&pIVar11->AutoPosLastDirection,&local_58,&local_f8,
                          ImGuiPopupPositionPolicy_ComboBox);
    local_60.x = 0.0;
    local_60.y = 0.0;
    SetNextWindowPos(&local_48,0,&local_60);
  }
  local_58.Min.y = (pIVar5->Style).WindowPadding.y;
  local_58.Min.x = (pIVar5->Style).FramePadding.x;
  PushStyleVar(1,&local_58.Min);
  bVar6 = Begin((char *)local_d8,(bool *)0x0,0x4000147);
  PopStyleVar(1);
  if (!bVar6) {
    EndPopup();
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                  ,0x5ed,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  return true;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    bool has_window_size_constraint = (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint) != 0;
    g.NextWindowData.Flags &= ~ImGuiNextWindowDataFlags_HasSizeConstraint;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float expected_w = CalcItemWidth();
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : expected_w;
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(frame_bb.Min.x, frame_bb.Max.x - arrow_size);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(value_x2, frame_bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, frame_bb.Min.y), frame_bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        if (value_x2 + arrow_size - style.FramePadding.x <= frame_bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, ImVec2(value_x2, frame_bb.Max.y), preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (has_window_size_constraint)
    {
        g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasSizeConstraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_expected = CalcWindowExpectedSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // We don't use BeginPopupEx() solely because we have a custom name string, which we could make an argument to BeginPopupEx()
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoMove;

    // Horizontally align ourselves with the framed text
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}